

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall Omega_h::each_max_with<double>(Omega_h *this,Read<double> *a,double b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  ulong uVar2;
  size_t sVar3;
  Read<double> RVar4;
  Write<double> c;
  type_conflict2 f;
  allocator local_69;
  Write<double> local_68;
  type_conflict2 local_58;
  double local_30;
  Write<signed_char> local_28;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  local_30 = b;
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<double>::Write(&local_68,(LO)(sVar3 >> 3),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<double>::Write(&local_58.c,&local_68);
  Write<double>::Write(&local_58.a.write_,&a->write_);
  local_58.b = local_30;
  if (((ulong)local_68.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (local_68.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)local_68.shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::each_max_with<double>(Omega_h::Read<double>,double)::_lambda(int)_1_>
            ((LO)(uVar2 >> 3),&local_58,"each_max_with");
  Write<double>::Write(&local_28,(Write<signed_char> *)&local_68);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  each_max_with<double>(Omega_h::Read<double>,double)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<double>::~Write(&local_68);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<T> each_max_with(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = max2(a[i], b); };
  parallel_for(c.size(), f, "each_max_with");
  return c;
}